

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.hpp
# Opt level: O2

void __thiscall
Database::ExecuteQueries<std::_List_iterator<std::__cxx11::string>>
          (Database *this,
          _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          begin,_List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                end)

{
  undefined8 *puVar1;
  Bulk_Query_Context local_50;
  _Bind<void_(Database::Bulk_Query_Context::*(Database::Bulk_Query_Context_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_40;
  _Bind<void_(Database::Bulk_Query_Context::*(Database::Bulk_Query_Context_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_28;
  
  local_50.db = this;
  local_50.pending = BeginTransaction(this);
  if (local_50.pending) {
    local_28._M_bound_args.
    super__Tuple_impl<0UL,_Database::Bulk_Query_Context_*,_std::_Placeholder<1>_>.
    super__Head_base<0UL,_Database::Bulk_Query_Context_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_Database::Bulk_Query_Context_*,_std::_Placeholder<1>_>)&local_50;
    local_28._M_f = (offset_in_Bulk_Query_Context_to_subr)Bulk_Query_Context::RawQuery;
    local_28._8_8_ = 0;
    std::
    for_each<std::_List_iterator<std::__cxx11::string>,std::_Bind<void(Database::Bulk_Query_Context::*(Database::Bulk_Query_Context*,std::_Placeholder<1>))(std::__cxx11::string_const&)>>
              (&local_40,begin,end,&local_28);
    Bulk_Query_Context::Commit(&local_50);
    Bulk_Query_Context::~Bulk_Query_Context(&local_50);
    return;
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar1 = &PTR__exception_001bc4f0;
  puVar1[1] = "Cannot execute bulk query with transaction in progress";
  __cxa_throw(puVar1,&Database_Exception::typeinfo,std::exception::~exception);
}

Assistant:

void ExecuteQueries(IT begin, IT end)
		{
			using namespace std::placeholders;

			Bulk_Query_Context qc(*this);

			if (!qc.Pending())
				throw Database_Exception("Cannot execute bulk query with transaction in progress");

			std::for_each(begin, end, std::bind(&Bulk_Query_Context::RawQuery, &qc, _1));

			qc.Commit();
		}